

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O1

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
* common::FeeModeMap_abi_cxx11_(void)

{
  int iVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long in_FS_OFFSET;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>
  __l;
  allocator_type local_a5;
  FeeEstimateMode local_a4 [3];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
  local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
  local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
  local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_);
    if (iVar1 != 0) {
      local_a4[2] = 0;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
      ::pair<const_char_(&)[6],_FeeEstimateMode,_true>(&local_98,(char (*) [6])"unset",local_a4 + 2)
      ;
      local_a4[1] = 1;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
      ::pair<const_char_(&)[11],_FeeEstimateMode,_true>
                (&local_70,(char (*) [11])0x4c507e,local_a4 + 1);
      local_a4[0] = CONSERVATIVE;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
      ::pair<const_char_(&)[13],_FeeEstimateMode,_true>
                (&local_48,(char (*) [13])"conservative",local_a4);
      __l._M_len = 3;
      __l._M_array = &local_98;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
      ::vector(&FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_,__l,&local_a5);
      lVar2 = -0x78;
      paVar3 = &local_48.first.field_2;
      do {
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar3->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar3->_M_allocated_capacity)[-2],
                          paVar3->_M_allocated_capacity + 1);
        }
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar3->_M_allocated_capacity + -5);
        lVar2 = lVar2 + 0x28;
      } while (lVar2 != 0);
      __cxa_atexit(std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
                   ::~vector,&FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return &FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_;
  }
  __stack_chk_fail();
}

Assistant:

const std::vector<std::pair<std::string, FeeEstimateMode>>& FeeModeMap()
{
    static const std::vector<std::pair<std::string, FeeEstimateMode>> FEE_MODES = {
        {"unset", FeeEstimateMode::UNSET},
        {"economical", FeeEstimateMode::ECONOMICAL},
        {"conservative", FeeEstimateMode::CONSERVATIVE},
    };
    return FEE_MODES;
}